

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

bool __thiscall
Clasp::ClaspStatistics::removeStat(ClaspStatistics *this,StatisticObject *obj,bool recurse)

{
  int iVar1;
  Type TVar2;
  uint32 uVar3;
  char *k;
  uint32 uVar4;
  StatisticObject local_38;
  
  iVar1 = Impl::remove(this->impl_,(char *)obj);
  if ((recurse & (byte)iVar1) == 1) {
    TVar2 = StatisticObject::type(obj);
    if (TVar2.val_ == Map) {
      uVar3 = StatisticObject::size(obj);
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        k = StatisticObject::key(obj,uVar4);
        local_38 = StatisticObject::at(obj,k);
        removeStat(this,&local_38,true);
      }
    }
    else {
      TVar2 = StatisticObject::type(obj);
      if (TVar2.val_ == Array) {
        uVar3 = StatisticObject::size(obj);
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          local_38 = StatisticObject::operator[](obj,uVar4);
          removeStat(this,&local_38,true);
        }
      }
    }
  }
  return (bool)(byte)iVar1;
}

Assistant:

bool ClaspStatistics::removeStat(const StatisticObject& obj, bool recurse) {
	bool ret = impl_->remove(obj);
	if (ret && recurse) {
		if (obj.type() == Potassco::Statistics_t::Map) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj.at(obj.key(i)), true);
			}
		}
		else if (obj.type() == Potassco::Statistics_t::Array) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj[i], true);
			}
		}
	}
	return ret;
}